

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeInt(IMkvReader *pReader,longlong pos,longlong size,longlong *result_ref)

{
  int iVar1;
  long status_1;
  long lStack_50;
  uchar b;
  long i;
  unsigned_long_long result;
  long status;
  longlong *plStack_30;
  char first_byte;
  longlong *result_ref_local;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if ((((pReader == (IMkvReader *)0x0) || (pos < 0)) || (size < 1)) || (8 < size)) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    status._7_1_ = '\0';
    plStack_30 = result_ref;
    result_ref_local = (longlong *)size;
    size_local = pos;
    pos_local = (longlong)pReader;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,(long)&status + 7);
    result = (unsigned_long_long)iVar1;
    pReader_local = (IMkvReader *)result;
    if (-1 < (long)result) {
      i = (long)status._7_1_;
      for (lStack_50 = 1; size_local = size_local + 1, lStack_50 < (long)result_ref_local;
          lStack_50 = lStack_50 + 1) {
        iVar1 = (*(code *)**(undefined8 **)pos_local)(pos_local,size_local,1,(long)&status_1 + 7);
        if ((long)iVar1 < 0) {
          return (long)iVar1;
        }
        i = (ulong)status_1._7_1_ | i << 8;
      }
      *plStack_30 = i;
      pReader_local = (IMkvReader *)0x0;
    }
  }
  return (long)pReader_local;
}

Assistant:

long UnserializeInt(IMkvReader* pReader, long long pos, long long size,
                    long long& result_ref) {
  if (!pReader || pos < 0 || size < 1 || size > 8)
    return E_FILE_FORMAT_INVALID;

  signed char first_byte = 0;
  const long status = pReader->Read(pos, 1, (unsigned char*)&first_byte);

  if (status < 0)
    return status;

  unsigned long long result = static_cast<unsigned long long>(first_byte);
  ++pos;

  for (long i = 1; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  result_ref = static_cast<long long>(result);
  return 0;
}